

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcryptohash.c
# Opt level: O1

void p_crypto_hash_get_digest(PCryptoHash *hash,puchar *buf,psize *len)

{
  ulong uVar1;
  puchar *__src;
  
  if (len == (psize *)0x0) {
    return;
  }
  uVar1 = 0;
  if ((hash != (PCryptoHash *)0x0) && (buf != (puchar *)0x0)) {
    if ((ulong)hash->hash_len <= *len) {
      if (hash->closed == 0) {
        (*hash->finish)(hash->context);
        hash->closed = 1;
      }
      __src = (*hash->digest)(hash->context);
      if (__src != (puchar *)0x0) {
        memcpy(buf,__src,(ulong)hash->hash_len);
        uVar1 = (ulong)hash->hash_len;
        goto LAB_00106cc3;
      }
    }
    uVar1 = 0;
  }
LAB_00106cc3:
  *len = uVar1;
  return;
}

Assistant:

P_LIB_API void
p_crypto_hash_get_digest (PCryptoHash *hash, puchar *buf, psize *len)
{
	const puchar *digest;

	if (P_UNLIKELY (len == NULL))
		return;

	if (P_UNLIKELY (hash == NULL || buf == NULL)) {
		*len = 0;
		return;
	}

	if (P_UNLIKELY (hash->hash_len > *len)) {
		*len = 0;
		return;
	}

	if (!hash->closed) {
		hash->finish (hash->context);
		hash->closed = TRUE;
	}

	if (P_UNLIKELY ((digest = hash->digest (hash->context)) == NULL)) {
		*len = 0;
		return;
	}

	memcpy (buf, digest, hash->hash_len);
	*len = hash->hash_len;
}